

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars)

{
  code *pcVar1;
  CharCount CVar2;
  CharCount CVar3;
  HRESULT HVar4;
  bool bVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ParseError *pPVar8;
  ulong uVar9;
  EncodedChar *pEVar10;
  long lVar11;
  RegexFlags local_31 [8];
  RegexFlags dummyFlags;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7c,"(input != 0)","input != 0");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7d,"(inputLim >= input)","inputLim >= input");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
  }
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  DisjunctionPass0(this,0);
  pEVar10 = this->next;
  lVar11 = (long)pEVar10 - (long)input;
  if (pEVar10 < input || 0x7ffffffe < lVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
    pEVar10 = this->next;
  }
  *outBodyEncodedChars = (CharCount)lVar11;
  uVar9 = (long)pEVar10 - (long)this->input;
  if (pEVar10 < this->input || 0x7ffffffe < (long)uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
  }
  uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  if ((uVar9 & 0xffffffff) < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
    uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  }
  *outBodyChars = (int)uVar9 - (int)uVar7;
  ECMust(this,'/',-0x7ff5fc0c);
  local_31[0] = NoRegexFlags;
  Options(this,local_31);
  this->unicodeFlagPresent = (bool)(local_31[0] >> 3 & 1);
  this->caseInsensitiveFlagPresent = (bool)(local_31[0] & IgnoreCaseRegexFlag);
  this->dotAllFlagPresent = (bool)(local_31[0] >> 5 & 1);
  pEVar10 = this->next;
  lVar11 = (long)pEVar10 - (long)input;
  if (pEVar10 < input || 0x7ffffffe < lVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
    pEVar10 = this->next;
  }
  *outTotalEncodedChars = (CharCount)lVar11;
  uVar9 = (long)pEVar10 - (long)this->input;
  if (pEVar10 < this->input || 0x7ffffffe < (long)uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ede410;
    *puVar6 = 0;
  }
  uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  if ((uVar9 & 0xffffffff) < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar5) {
LAB_00ede410:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  }
  *outTotalChars = (int)uVar9 - (int)uVar7;
  if ((this->deferredIfNotUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != false))
  {
    if ((this->deferredIfUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != true)) {
      return;
    }
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar8 = this->deferredIfUnicodeError;
  }
  else {
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar8 = this->deferredIfNotUnicodeError;
  }
  CVar2 = pPVar8->pos;
  CVar3 = pPVar8->encodedPos;
  HVar4 = pPVar8->error;
  *puVar6 = *(undefined4 *)pPVar8;
  puVar6[1] = CVar2;
  puVar6[2] = CVar3;
  puVar6[3] = HVar4;
  __cxa_throw(puVar6,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::ParseLiteralNoAST
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // Body, pass 0
        SetPosition(input, inputLim, true);
        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options
        ECMust('/', ERRnoSlash);
        RegexFlags dummyFlags = NoRegexFlags;
        Options(dummyFlags);
        this->unicodeFlagPresent = (dummyFlags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (dummyFlags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (dummyFlags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }
    }